

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_each.cpp
# Opt level: O0

void __thiscall tst_qpromise_each::functorThrows(tst_qpromise_each *this)

{
  initializer_list<int> args;
  QPromise<QList<int>_> QVar1;
  QString local_c0;
  QString local_a8;
  QString local_90;
  int local_64 [3];
  iterator local_58;
  undefined8 local_50;
  QList<int> local_48;
  QPromise<QList<int>_> local_30;
  undefined1 local_20 [8];
  QPromise<QList<int>_> p;
  tst_qpromise_each *this_local;
  
  local_64[0] = 0x2a;
  local_64[1] = 0x2b;
  local_64[2] = 0x2c;
  local_58 = local_64;
  local_50 = 3;
  args._M_len = 3;
  args._M_array = local_58;
  p.super_QPromiseBase<QList<int>_>.m_d.d = (PromiseData<QList<int>_> *)this;
  QList<int>::QList(&local_48,args);
  QVar1 = QtPromise::QPromise<QList<int>_>::resolve(&local_30,&local_48);
  QtPromise::QPromise<QList<int>>::each<tst_qpromise_each::functorThrows()::__0>
            ((QPromise<QList<int>> *)local_20,&local_30,
             QVar1.super_QPromiseBase<QList<int>_>.m_d.d.d);
  QtPromise::QPromise<QList<int>_>::~QPromise(&local_30);
  QList<int>::~QList(&local_48);
  QString::QString(&local_a8);
  waitForError<QList<int>,QString>(&local_90,(QPromise<QList<int>_> *)local_20,&local_a8);
  QString::QString(&local_c0,"foo");
  QTest::qCompare(&local_90,&local_c0,"waitForError(p, QString{})","QString{\"foo\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_each.cpp"
                  ,0x93);
  QString::~QString(&local_c0);
  QString::~QString(&local_90);
  QString::~QString(&local_a8);
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_20);
  return;
}

Assistant:

void tst_qpromise_each::functorThrows()
{
    auto p = QtPromise::QPromise<QVector<int>>::resolve({42, 43, 44}).each([](int v, ...) {
        if (v == 44) {
            throw QString{"foo"};
        }
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
}